

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamma_dist.hpp
# Opt level: O0

result_type_conflict2 __thiscall
trng::gamma_dist<double>::pdf(gamma_dist<double> *this,result_type_conflict2 x)

{
  param_type *in_RDI;
  double in_XMM0_Qa;
  result_type_conflict2 rVar1;
  result_type_conflict2 rVar2;
  double dVar3;
  double dVar4;
  undefined8 local_8;
  
  if (0.0 <= in_XMM0_Qa) {
    rVar1 = param_type::theta(in_RDI);
    rVar2 = param_type::kappa(in_RDI);
    dVar3 = math::ln(1.71146958267331e-317);
    param_type::kappa(in_RDI);
    dVar4 = math::ln_Gamma(1.71150219100593e-317);
    local_8 = exp(((rVar2 - 1.0) * dVar3 + -(in_XMM0_Qa / rVar1)) - dVar4);
    rVar1 = param_type::theta(in_RDI);
    local_8 = local_8 / rVar1;
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

pdf(result_type x) const {
      if (x < 0)
        return 0;
      x /= P.theta();
      return math::exp((P.kappa() - 1) * math::ln(x) - x - math::ln_Gamma(P.kappa())) /
             (P.theta());
    }